

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

real __thiscall fasttext::Vector::norm(Vector *this)

{
  pointer pfVar1;
  pointer pfVar2;
  long lVar3;
  ulong uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar6 = ZEXT816(0) << 0x40;
  lVar3 = (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar2;
  uVar4 = 0;
  while ((~(lVar3 >> 0x3f) & lVar3 >> 2) != uVar4) {
    pfVar1 = pfVar2 + uVar4;
    uVar4 = uVar4 + 1;
    auVar7 = ZEXT416((uint)*pfVar1);
    auVar6 = vfmadd231ss_fma(auVar6,auVar7,auVar7);
  }
  if (0.0 <= auVar6._0_4_) {
    auVar6 = vsqrtss_avx(auVar6,auVar6);
    return auVar6._0_4_;
  }
  fVar5 = sqrtf(auVar6._0_4_);
  return fVar5;
}

Assistant:

real Vector::norm() const {
  real sum = 0;
  for (int64_t i = 0; i < size(); i++) {
    sum += data_[i] * data_[i];
  }
  return std::sqrt(sum);
}